

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_datatype_from_string(char *name)

{
  int iVar1;
  long lVar2;
  
  if (name == (char *)0x0) {
    return 0;
  }
  for (lVar2 = 0x3f0; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    iVar1 = strcmp(name,*(char **)((long)&nifti_type_list[0].name + lVar2));
    if (iVar1 == 0) break;
  }
  return *(int *)((long)&nifti_type_list[0].type + lVar2);
}

Assistant:

int nifti_datatype_from_string( const char * name )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    if( !name ) return DT_UNKNOWN;

    for( c = tablen-1; c > 0; c-- )
        if( !strcmp(name, nifti_type_list[c].name) )
            break;

    return nifti_type_list[c].type;
}